

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O0

void button_state_destroy(natwm_state *state)

{
  natwm_state *state_local;
  
  if (state->button_state->modifiers != (toggle_modifiers *)0x0) {
    free(state->button_state->modifiers->masks);
    free(state->button_state->modifiers);
  }
  if (state->button_state->resize_helper != 0) {
    xcb_unmap_window(state->xcb,state->button_state->resize_helper);
  }
  free(state->button_state);
  return;
}

Assistant:

void button_state_destroy(struct natwm_state *state)
{
        if (state->button_state->modifiers != NULL) {
                free(state->button_state->modifiers->masks);
                free(state->button_state->modifiers);
        }

        if (state->button_state->resize_helper != XCB_NONE) {
                xcb_unmap_window(state->xcb, state->button_state->resize_helper);
        }

        free(state->button_state);
}